

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O2

bool __thiscall
brynet::net::TcpService::helpAddChannel
          (TcpService *this,PTR channel,string *ip,ENTER_CALLBACK *enterCallback,
          DISCONNECT_CALLBACK *disConnectCallback,DATA_CALLBACK *dataCallback,
          bool forceSameThreadLoop)

{
  EventLoop *this_00;
  element_type *peVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  bool bVar6;
  int iVar7;
  string *this_01;
  __shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2> *this_02;
  pointer psVar8;
  pointer psVar9;
  size_t i;
  ulong uVar10;
  long lVar11;
  shared_ptr<brynet::net::IOLoopData> ioLoopData;
  shared_ptr<brynet::net::TcpService> shared_this;
  __shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2> local_128;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  __shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2> local_d8;
  PTR local_c8;
  ulong local_b8;
  function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b0;
  function<void_(long)> local_90;
  function<unsigned_long_(long,_const_char_*,_unsigned_long)> local_70;
  __shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  ioLoopData.super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ioLoopData.super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar7 = rand();
  std::mutex::lock(&this->mIOLoopGuard);
  psVar8 = (this->mIOLoopDatas).
           super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar9 = (this->mIOLoopDatas).
           super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar8 != psVar9) {
    if (!forceSameThreadLoop) {
      uVar10 = (ulong)(long)iVar7 % (ulong)((long)psVar9 - (long)psVar8 >> 4);
LAB_001303de:
      std::__shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&ioLoopData.super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>
                 ,&psVar8[uVar10].
                   super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>);
      bVar6 = true;
      goto LAB_001303f3;
    }
    lVar11 = 0;
    for (uVar10 = 0; uVar10 < (ulong)((long)psVar9 - (long)psVar8 >> 4); uVar10 = uVar10 + 1) {
      bVar6 = EventLoop::isInLoopThread
                        (*(EventLoop **)
                          (*(long *)((long)&(psVar8->
                                            super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar11) + 0x10));
      if (bVar6) {
        psVar8 = (this->mIOLoopDatas).
                 super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_001303de;
      }
      psVar8 = (this->mIOLoopDatas).
               super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar9 = (this->mIOLoopDatas).
               super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar11 = lVar11 + 0x10;
    }
  }
  uVar10 = 0;
  bVar6 = false;
LAB_001303f3:
  pthread_mutex_unlock((pthread_mutex_t *)&this->mIOLoopGuard);
  peVar1 = ioLoopData.super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (bVar6 != false) {
    local_128._M_ptr =
         ioLoopData.super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_128._M_refcount._M_pi =
         ioLoopData.super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    ioLoopData.super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    ioLoopData.super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<brynet::net::TcpService,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<brynet::net::TcpService,void>
              ((__shared_ptr<brynet::net::TcpService,(__gnu_cxx::_Lock_policy)2> *)&shared_this,
               (__weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<brynet::net::TcpService>);
    std::__cxx11::string::string((string *)&local_d8,(string *)ip);
    local_b8 = uVar10;
    std::
    function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function(&local_b0,enterCallback);
    std::function<void_(long)>::function(&local_90,disConnectCallback);
    std::function<unsigned_long_(long,_const_char_*,_unsigned_long)>::function
              (&local_70,dataCallback);
    std::__shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               &shared_this.super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>)
    ;
    std::__shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&local_128);
    local_e8 = (code *)0x0;
    pcStack_e0 = (code *)0x0;
    local_f8._M_unused._M_object = (void *)0x0;
    local_f8._8_8_ = 0;
    this_01 = (string *)operator_new(0xa8);
    std::__cxx11::string::string(this_01,(string *)&local_d8);
    *(ulong *)(this_01 + 0x20) = local_b8;
    std::
    function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function((function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)(this_01 + 0x28),&local_b0);
    std::function<void_(long)>::function((function<void_(long)> *)(this_01 + 0x48),&local_90);
    std::function<unsigned_long_(long,_const_char_*,_unsigned_long)>::function
              ((function<unsigned_long_(long,_const_char_*,_unsigned_long)> *)(this_01 + 0x68),
               &local_70);
    _Var5._M_pi = local_40._M_refcount._M_pi;
    peVar4 = local_40._M_ptr;
    _Var3._M_pi = local_50._M_refcount._M_pi;
    peVar2 = local_50._M_ptr;
    local_50._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_50._M_ptr = (element_type *)0x0;
    local_40._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_40._M_ptr = (element_type *)0x0;
    *(element_type **)(this_01 + 0x88) = peVar2;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this_01 + 0x90) = _Var3._M_pi;
    *(element_type **)(this_01 + 0x98) = peVar4;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this_01 + 0xa0) = _Var5._M_pi;
    pcStack_e0 = std::
                 _Function_handler<void_(brynet::net::DataSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/TCPService.cpp:366:31)>
                 ::_M_invoke;
    local_e8 = std::
               _Function_handler<void_(brynet::net::DataSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/TCPService.cpp:366:31)>
               ::_M_manager;
    local_f8._M_unused._0_8_ = (undefined8)this_01;
    DataSocket::setEnterCallback(channel,(ENTER_CALLBACK *)&local_f8);
    std::_Function_base::~_Function_base((_Function_base *)&local_f8);
    helpAddChannel(brynet::net::DataSocket*,std::__cxx11::string_const&,std::function<void(long,std::__cxx11::string_const&)>const&,std::function<void(long)>const&,std::function<unsigned_long(long,char_const*,unsigned_long)>const&,bool)
    ::$_0::~__0((__0 *)&local_d8);
    this_00 = (peVar1->mEventLoop).
              super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d8,
               &(peVar1->mEventLoop).
                super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>);
    local_118._M_unused._M_object = (void *)0x0;
    local_118._8_8_ = 0;
    local_108 = (code *)0x0;
    pcStack_100 = (code *)0x0;
    local_c8 = channel;
    this_02 = (__shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18)
    ;
    std::__shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (this_02,&local_d8);
    this_02[1]._M_ptr = (element_type *)local_c8;
    pcStack_100 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/TCPService.cpp:398:25)>
                  ::_M_invoke;
    local_108 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/TCPService.cpp:398:25)>
                ::_M_manager;
    local_118._M_unused._M_object = this_02;
    EventLoop::pushAsyncProc(this_00,(USER_PROC *)&local_118);
    std::_Function_base::~_Function_base((_Function_base *)&local_118);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&shared_this.super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ioLoopData.super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return bVar6;
}

Assistant:

bool TcpService::helpAddChannel(DataSocket::PTR channel, 
    const std::string& ip, 
    const TcpService::ENTER_CALLBACK& enterCallback, 
    const TcpService::DISCONNECT_CALLBACK& disConnectCallback, 
    const TcpService::DATA_CALLBACK& dataCallback,
    bool forceSameThreadLoop)
{
    std::shared_ptr<IOLoopData> ioLoopData;
    size_t loopIndex = 0;
    {
        auto randNum = rand();
        std::lock_guard<std::mutex> lock(mIOLoopGuard);

        if (mIOLoopDatas.empty())
        {
            return false;
        }
        
        if (forceSameThreadLoop)
        {
            bool find = false;
            for (size_t i = 0; i < mIOLoopDatas.size(); i++)
            {
                if (mIOLoopDatas[i]->getEventLoop()->isInLoopThread())
                {
                    loopIndex = i;
                    find = true;
                    break;
                }
            }
            if (!find)
            {
                return false;
            }
        }
        else
        {
            loopIndex = randNum % mIOLoopDatas.size();
        }

        ioLoopData = mIOLoopDatas[loopIndex];
    }
    

    const auto& loop = ioLoopData->getEventLoop();
    auto loopDataCapture = std::move(ioLoopData);
    auto shared_this = shared_from_this();
    channel->setEnterCallback([ip, 
        loopIndex, 
        enterCallback, 
        disConnectCallback, 
        dataCallback, 
        shared_this,
        loopDataCapture](DataSocket::PTR dataSocket){
        auto id = shared_this->MakeID(loopIndex, loopDataCapture);
        union SessionId sid;
        sid.id = id;
        loopDataCapture->getDataSockets().set(dataSocket, sid.data.index);
        dataSocket->setUD(id);
        dataSocket->setDataCallback([dataCallback, 
            id](DataSocket::PTR ds, const char* buffer, size_t len){
            return dataCallback(id, buffer, len);
        });

        dataSocket->setDisConnectCallback([disConnectCallback, 
            id, 
            shared_this](DataSocket::PTR arg){
            shared_this->procDataSocketClose(arg);
            disConnectCallback(id);
            delete arg;
        });

        if (enterCallback != nullptr)
        {
            enterCallback(id, ip);
        }
    });

    //TODO::����channel �ڴ�����ȫ�ķ�ʽ
    loop->pushAsyncProc([loop, channel](){
        if (!channel->onEnterEventLoop(std::move(loop)))
        {
            delete channel;
        }
    });

    return true;
}